

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTOpenSky.cpp
# Opt level: O3

unsigned_long GetHexId(string *ln)

{
  char *__nptr;
  int iVar1;
  ulong uVar2;
  
  if (ln->_M_string_length == 6) {
    __nptr = (ln->_M_dataplus)._M_p;
    iVar1 = isxdigit((int)*__nptr);
    if (iVar1 != 0) {
      iVar1 = isxdigit((int)__nptr[1]);
      if (iVar1 != 0) {
        iVar1 = isxdigit((int)__nptr[2]);
        if (iVar1 != 0) {
          iVar1 = isxdigit((int)__nptr[3]);
          if (iVar1 != 0) {
            iVar1 = isxdigit((int)__nptr[4]);
            if (iVar1 != 0) {
              iVar1 = isxdigit((int)__nptr[5]);
              if (iVar1 != 0) {
                uVar2 = strtoul(__nptr,(char **)0x0,0x10);
                return uVar2;
              }
            }
          }
        }
      }
    }
  }
  return 0xf000000;
}

Assistant:

unsigned long GetHexId (const std::string& ln)
{
    // must have exactly 6 chars
    if (ln.size() != 6)
        return 0x0F000000UL;
    
    // Test for all hex digits
    if (!std::all_of(ln.begin(),
                     ln.end(),
                     [](const char& ch){ return std::isxdigit(ch); }))
        return 0x0F000000UL;

    // convert text to number
    return std::strtoul(ln.c_str(), nullptr, 16);
}